

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LodRenderer.cpp
# Opt level: O0

void __thiscall
LodRenderer::removeDecoration(LodRenderer *this,repr coords,uint tileIndex,Drawable *drawable)

{
  bool bVar1;
  pointer ppVar2;
  Drawable *in_RCX;
  unsigned_long *in_RSI;
  FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_> *in_RDI;
  iterator deco;
  iterator chunkDeco;
  FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_> *in_stack_ffffffffffffffb0;
  iterator in_stack_ffffffffffffffb8;
  __normal_iterator<std::pair<unsigned_int,_const_sf::Drawable_*>_*,_std::vector<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>_>
  local_30;
  __normal_iterator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_*,_std::vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>_>
  local_28;
  Drawable *local_20;
  
  local_20 = in_RCX;
  local_28._M_current =
       (pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>
        *)FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
          ::find((FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
                  *)in_RDI,in_RSI);
  __gnu_cxx::
  __normal_iterator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_*,_std::vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>_>
  ::operator->(&local_28);
  local_30._M_current =
       (pair<unsigned_int,_const_sf::Drawable_*> *)
       FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>::find
                 (in_RDI,(uint *)in_RSI);
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<unsigned_int,_const_sf::Drawable_*>_*,_std::vector<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>_>
           ::operator->(&local_30);
  if (ppVar2->second == local_20) {
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_*,_std::vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>_>
    ::operator->(&local_28);
    FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>::erase
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_*,_std::vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>_>
    ::operator->(&local_28);
    bVar1 = FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>::empty
                      ((FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_> *)
                       0x1ed7fa);
    if (bVar1) {
      FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
      ::erase((FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
               *)in_stack_ffffffffffffffb0,(iterator)local_28._M_current);
    }
  }
  return;
}

Assistant:

void LodRenderer::removeDecoration(ChunkCoords::repr coords, unsigned int tileIndex, const sf::Drawable* drawable) {
    auto chunkDeco = decorations_.find(coords);
    auto deco = chunkDeco->second.find(tileIndex);
    if (deco->second != drawable) {
        // Do nothing if there is a different drawable at the selected coordinates.
        return;
    }
    chunkDeco->second.erase(deco);
    if (chunkDeco->second.empty()) {
        decorations_.erase(chunkDeco);
    }
}